

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O0

bool LoadScriptFile(int lumpnum,FileReader *lump,int numnodes,bool include,int type)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  char local_3c;
  char local_3b;
  char local_3a;
  char local_39;
  bool isbinary;
  FStrifeDialogueNode *pFStack_38;
  char buffer [4];
  FStrifeDialogueNode *node;
  int local_28;
  DWORD prevSpeakerType;
  int i;
  int type_local;
  bool include_local;
  FileReader *pFStack_18;
  int numnodes_local;
  FileReader *lump_local;
  int lumpnum_local;
  
  prevSpeakerType = type;
  i._3_1_ = include;
  type_local = numnodes;
  pFStack_18 = lump;
  lump_local._0_4_ = lumpnum;
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&local_3c,4);
  (*(pFStack_18->super_FileReaderBase)._vptr_FileReaderBase[4])(pFStack_18,0xfffffffffffffffc,1);
  bVar3 = true;
  if (((local_3c != '\0') && (bVar3 = true, local_3b != '\0')) && (bVar3 = true, local_3a != '\0'))
  {
    bVar3 = local_39 == '\0';
  }
  if (((prevSpeakerType != 1) || (bVar3)) && ((prevSpeakerType != 2 || (!bVar3)))) {
    if (bVar3) {
      if ((i._3_1_ & 1) == 0) {
        LoadScriptFile("SCRIPT00",true,1);
      }
      if ((gameinfo.flags & 2U) == 0) {
        if (type_local % 0x5ec != 0) {
          pcVar2 = FWadCollection::GetLumpFullName(&Wads,(int)lump_local);
          DPrintf(1,"Incorrect data format for conversation script in %s.\n",pcVar2);
          return false;
        }
        type_local = type_local / 0x5ec;
      }
      else {
        if (type_local % 0x5d0 != 0) {
          pcVar2 = FWadCollection::GetLumpFullName(&Wads,(int)lump_local);
          DPrintf(1,"Incorrect data format for conversation script in %s.\n",pcVar2);
          return false;
        }
        type_local = type_local / 0x5d0;
      }
      node._4_4_ = 0;
      for (local_28 = 0; local_28 < type_local; local_28 = local_28 + 1) {
        if ((gameinfo.flags & 2U) == 0) {
          pFStack_38 = ReadRetailNode(pFStack_18,(DWORD *)((long)&node + 4));
        }
        else {
          pFStack_38 = ReadTeaserNode(pFStack_18,(DWORD *)((long)&node + 4));
        }
        uVar1 = TArray<FStrifeDialogueNode_*,_FStrifeDialogueNode_*>::Push
                          (&StrifeDialogues,&stack0xffffffffffffffc8);
        pFStack_38->ThisNodeNum = uVar1;
      }
    }
    else {
      P_ParseUSDF((int)lump_local,pFStack_18,type_local);
    }
    return true;
  }
  pcVar2 = FWadCollection::GetLumpFullName(&Wads,(int)lump_local);
  DPrintf(1,"Incorrect data format for conversation script in %s.\n",pcVar2);
  return false;
}

Assistant:

static bool LoadScriptFile(int lumpnum, FileReader *lump, int numnodes, bool include, int type)
{
	int i;
	DWORD prevSpeakerType;
	FStrifeDialogueNode *node;
	char buffer[4];

	lump->Read(buffer, 4);
	lump->Seek(-4, SEEK_CUR);

	// The binary format is so primitive that this check is enough to detect it.
	bool isbinary = (buffer[0] == 0 || buffer[1] == 0 || buffer[2] == 0 || buffer[3] == 0);

	if ((type == 1 && !isbinary) || (type == 2 && isbinary))
	{
		DPrintf(DMSG_ERROR, "Incorrect data format for conversation script in %s.\n", Wads.GetLumpFullName(lumpnum));
		return false;
	}

	if (!isbinary)
	{
		P_ParseUSDF(lumpnum, lump, numnodes);
	}
	else 
	{
		if (!include)
		{
			LoadScriptFile("SCRIPT00", true, 1);
		}
		if (!(gameinfo.flags & GI_SHAREWARE))
		{
			// Strife scripts are always a multiple of 1516 bytes because each entry
			// is exactly 1516 bytes long.
			if (numnodes % 1516 != 0)
			{
				DPrintf(DMSG_ERROR, "Incorrect data format for conversation script in %s.\n", Wads.GetLumpFullName(lumpnum));
				return false;
			}
			numnodes /= 1516;
		}
		else
		{
			// And the teaser version has 1488-byte entries.
			if (numnodes % 1488 != 0)
			{
				DPrintf(DMSG_ERROR, "Incorrect data format for conversation script in %s.\n", Wads.GetLumpFullName(lumpnum));
				return false;
			}
			numnodes /= 1488;
		}

		prevSpeakerType = 0;

		for (i = 0; i < numnodes; ++i)
		{
			if (!(gameinfo.flags & GI_SHAREWARE))
			{
				node = ReadRetailNode (lump, prevSpeakerType);
			}
			else
			{
				node = ReadTeaserNode (lump, prevSpeakerType);
			}
			node->ThisNodeNum = StrifeDialogues.Push(node);
		}
	}
	return true;
}